

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall
kratos::PackedStruct::PackedStruct
          (PackedStruct *this,string *struct_name,
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *attributes)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  PackedStructFieldDef local_68;
  PackedStruct *local_38;
  
  std::__cxx11::string::string((string *)this,(string *)struct_name);
  *(undefined8 *)
   ((long)&(this->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->attributes).
  super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes).
  super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = *(uint32_t **)(attributes + 8);
  local_38 = this;
  for (puVar2 = *(uint32_t **)attributes; puVar2 != puVar1; puVar2 = puVar2 + 10) {
    local_68.struct_ = (PackedStruct *)0x0;
    local_68.name.field_2._M_allocated_capacity = 0;
    local_68.name.field_2._8_8_ = 0;
    local_68.name._M_string_length = 0;
    local_68.width = 0;
    local_68.signed_ = false;
    local_68._37_3_ = 0;
    local_68.name._M_dataplus._M_p = (pointer)&local_68.name.field_2;
    std::__cxx11::string::_M_assign((string *)&local_68);
    local_68.width = *puVar2;
    std::vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>>::
    emplace_back<kratos::PackedStructFieldDef&>
              ((vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>> *)
               &this->attributes,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

PackedStruct::PackedStruct(std::string struct_name,
                           const std::vector<std::tuple<std::string, uint32_t>> &attributes)
    : struct_name(std::move(struct_name)) {
    for (auto const &[name, size] : attributes) {
        auto def = PackedStructFieldDef();
        def.signed_ = false;
        def.name = name;
        def.width = size;
        this->attributes.emplace_back(def);
    }
}